

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsPartOf_PDU.cpp
# Opt level: O3

KBOOL __thiscall KDIS::PDU::IsPartOf_PDU::operator==(IsPartOf_PDU *this,IsPartOf_PDU *Value)

{
  KBOOL KVar1;
  
  KVar1 = Simulation_Management_Header::operator!=
                    (&this->super_Simulation_Management_Header,
                     &Value->super_Simulation_Management_Header);
  if ((((!KVar1) &&
       (KVar1 = DATA_TYPE::RelationshipRecord::operator!=(&this->m_RelRec,&Value->m_RelRec), !KVar1)
       ) && (KVar1 = DATA_TYPE::Vector::operator!=(&this->m_LocPrt,&Value->m_LocPrt), !KVar1)) &&
     (KVar1 = DATA_TYPE::NamedLocationIdentifier::operator!=(&this->m_NmLocID,&Value->m_NmLocID),
     !KVar1)) {
    KVar1 = DATA_TYPE::EntityType::operator!=(&this->m_PrtTyp,&Value->m_PrtTyp);
    return !KVar1;
  }
  return false;
}

Assistant:

KBOOL IsPartOf_PDU::operator == ( const IsPartOf_PDU & Value ) const
{
    if( Simulation_Management_Header::operator !=( Value ) )        return false;
    if( m_RelRec                               != Value.m_RelRec )  return false;
    if( m_LocPrt                               != Value.m_LocPrt )  return false;
    if( m_NmLocID                              != Value.m_NmLocID ) return false;
    if( m_PrtTyp                               != Value.m_PrtTyp )  return false;
    return true;
}